

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

HashEntry * raviX_hash_table_next_entry(HashTable *ht,HashEntry *entry)

{
  int iVar1;
  HashEntry *local_20;
  HashEntry *entry_local;
  HashTable *ht_local;
  
  if (entry == (HashEntry *)0x0) {
    local_20 = ht->table;
  }
  else {
    local_20 = entry + 1;
  }
  while( true ) {
    if (local_20 == ht->table + ht->size) {
      return (HashEntry *)0x0;
    }
    iVar1 = entry_is_present(local_20);
    if (iVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

HashEntry *
raviX_hash_table_next_entry(HashTable *ht, HashEntry *entry)
{
	if (entry == NULL)
		entry = ht->table;
	else
		entry = entry + 1;

	for (; entry != ht->table + ht->size; entry++) {
		if (entry_is_present(entry)) {
			return entry;
		}
	}

	return NULL;
}